

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O0

void makeContextCurrentOSMesa(_GLFWwindow *window)

{
  int iVar1;
  void *pvVar2;
  _GLFWwindow *in_RDI;
  size_t unaff_retaddr;
  int height;
  int width;
  void *in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  if (in_RDI != (_GLFWwindow *)0x0) {
    (*_glfw.platform.getFramebufferSize)
              (in_RDI,(int *)&stack0xfffffffffffffff4,(int *)&stack0xfffffffffffffff0);
    if ((((in_RDI->context).osmesa.buffer == (void *)0x0) ||
        (in_stack_fffffffffffffff4 != (in_RDI->context).osmesa.width)) ||
       (in_stack_fffffffffffffff0 != (in_RDI->context).osmesa.height)) {
      _glfw_free((void *)0x9f4726);
      pvVar2 = _glfw_calloc(_height,unaff_retaddr);
      (in_RDI->context).osmesa.buffer = pvVar2;
      (in_RDI->context).osmesa.width = in_stack_fffffffffffffff4;
      (in_RDI->context).osmesa.height = in_stack_fffffffffffffff0;
    }
    iVar1 = (*_glfw.osmesa.MakeCurrent)
                      ((in_RDI->context).osmesa.handle,(in_RDI->context).osmesa.buffer,0x1401,
                       in_stack_fffffffffffffff4,in_stack_fffffffffffffff0);
    if (iVar1 == 0) {
      _glfwInputError(0x10008,"OSMesa: Failed to make context current");
      return;
    }
  }
  _glfwPlatformSetTls((_GLFWtls *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                      in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void makeContextCurrentOSMesa(_GLFWwindow* window)
{
    if (window)
    {
        int width, height;
        _glfw.platform.getFramebufferSize(window, &width, &height);

        // Check to see if we need to allocate a new buffer
        if ((window->context.osmesa.buffer == NULL) ||
            (width != window->context.osmesa.width) ||
            (height != window->context.osmesa.height))
        {
            _glfw_free(window->context.osmesa.buffer);

            // Allocate the new buffer (width * height * 8-bit RGBA)
            window->context.osmesa.buffer = _glfw_calloc(4, (size_t) width * height);
            window->context.osmesa.width  = width;
            window->context.osmesa.height = height;
        }

        if (!OSMesaMakeCurrent(window->context.osmesa.handle,
                               window->context.osmesa.buffer,
                               GL_UNSIGNED_BYTE,
                               width, height))
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "OSMesa: Failed to make context current");
            return;
        }
    }

    _glfwPlatformSetTls(&_glfw.contextSlot, window);
}